

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

bool fmt::v9::detail::check_cstring_type_spec<fmt::v9::detail::error_handler>
               (presentation_type type,error_handler *eh)

{
  error_handler *in_RSI;
  char in_DIL;
  char *in_stack_ffffffffffffffe8;
  undefined1 local_1;
  
  if (((in_DIL == '\0') || (in_DIL == '\x10')) || (in_DIL == '\x12')) {
    local_1 = true;
  }
  else {
    if (in_DIL != '\x11') {
      error_handler::on_error(in_RSI,in_stack_ffffffffffffffe8);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

FMT_CONSTEXPR auto check_cstring_type_spec(presentation_type type,
                                           ErrorHandler&& eh = {}) -> bool {
  if (type == presentation_type::none || type == presentation_type::string ||
      type == presentation_type::debug)
    return true;
  if (type != presentation_type::pointer) eh.on_error("invalid type specifier");
  return false;
}